

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3443.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellANCF_3443::PrecomputeInternalForceMatricesWeightsContInt
          (ChElementShellANCF_3443 *this)

{
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint uVar13;
  long lVar14;
  ulong uVar15;
  char *__function;
  double *pdVar16;
  ActualDstType actualDst;
  double *pdVar17;
  double *pdVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  ChMatrix33<double> J_0xi;
  ChMatrixNM<double,_NSF,_3>_conflict3 SD_precompute_D;
  MatrixNx3c Sxi_D;
  assign_op<double,_double> local_4c9;
  ulong local_4c8;
  long local_4c0;
  long local_4b8;
  long local_4b0;
  ulong local_4a8;
  ulong local_4a0;
  Matrix3xN *local_498;
  long local_490;
  double local_488;
  double local_480;
  long local_478;
  ulong local_470;
  ulong local_468;
  ulong local_460;
  double local_458;
  MatrixNx3c *local_450;
  SrcXprType local_448;
  Matrix<double,_3,_3,_1,_3,_3> local_440;
  MatrixNx3c *local_3e8;
  Matrix<double,_3,_3,_1,_3,_3> local_3e0;
  MatrixNx3c *local_398;
  Matrix<double,_3,_3,_1,_3,_3> *local_390;
  undefined8 local_388;
  undefined1 local_380 [16];
  double adStack_370 [6];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  MatrixNx3c local_200;
  
  uVar13 = this->m_numLayers * 0x60;
  if ((int)uVar13 < 0) {
    __function = 
    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>]"
    ;
  }
  else {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
              ((DenseStorage<double,__1,__1,__1,_1> *)&this->m_SD,(ulong)uVar13 << 4,0x10,
               (ulong)uVar13);
    if (-1 < this->m_numLayers) {
      uVar15 = (ulong)(uint)(this->m_numLayers << 5);
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)&this->m_kGQ,uVar15,uVar15,1);
      if (this->m_numLayers != 0) {
        local_498 = &this->m_ebar0;
        local_4b8 = 0x20;
        local_4c0 = 0x40;
        local_4b0 = 0;
        local_4c8 = 0;
        do {
          if (*(long *)(DAT_00b92d28 + 0x50) != *(long *)(DAT_00b92d28 + 0x48)) {
            local_478 = local_4c8 * 0x20;
            local_480 = (this->m_layers).
                        super__Vector_base<chrono::fea::ChElementShellANCF_3443::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3443::Layer>_>
                        ._M_impl.super__Vector_impl_data._M_start[local_4c8].m_thickness;
            local_488 = local_480 * 0.5 +
                        ((this->m_layer_zoffsets).
                         super__Vector_base<double,_Eigen::aligned_allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[local_4c8] - this->m_thicknessZ * 0.5) +
                        this->m_midsurfoffset;
            local_490 = local_4c8 * 0x60;
            local_4a8 = 0;
            do {
              iVar19 = (int)local_4a8;
              if (*(long *)(DAT_00b92d28 + 0x50) != *(long *)(DAT_00b92d28 + 0x48)) {
                local_4a0 = 0;
                uVar15 = local_4a8;
                local_470 = local_4a8;
                do {
                  lVar14 = *(long *)(DAT_00b92d28 + 0x18);
                  lVar21 = *(long *)(DAT_00b92d28 + 0x20) - lVar14;
                  local_468 = local_4a0;
                  if (lVar21 != 0) {
                    uVar22 = lVar21 >> 3;
                    local_460 = 0;
                    do {
                      local_458 = *(double *)(*(long *)(static_tables_3443 + 0x48) + local_4a8 * 8)
                                  * *(double *)
                                     (*(long *)(static_tables_3443 + 0x48) + local_4a0 * 8) *
                                  *(double *)(*(long *)(static_tables_3443 + 0x18) + local_460 * 8);
                      lVar21 = *(long *)(DAT_00b92d28 + 0x48);
                      lVar23 = *(long *)(DAT_00b92d28 + 0x50) - lVar21 >> 3;
                      lVar20 = (lVar23 * local_4a8 + local_4a0) * uVar22 + local_460;
                      Calc_Sxi_D(this,&local_200,*(double *)(lVar21 + local_4a8 * 8),
                                 *(double *)(lVar21 + local_4a0 * 8),
                                 *(double *)(lVar14 + local_460 * 8),local_480,local_488);
                      local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                      m_storage.m_data.array[0] = 0.0;
                      local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                      m_storage.m_data.array[1] = 0.0;
                      local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                      m_storage.m_data.array[2] = 0.0;
                      local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                      m_storage.m_data.array[3] = 0.0;
                      local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                      m_storage.m_data.array[4] = 0.0;
                      local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                      m_storage.m_data.array[5] = 0.0;
                      local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                      m_storage.m_data.array[6] = 0.0;
                      local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                      m_storage.m_data.array[7] = 0.0;
                      local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                      m_storage.m_data.array[8] = 0.0;
                      local_3e8 = (MatrixNx3c *)0x3ff0000000000000;
                      Eigen::internal::
                      generic_product_impl<Eigen::Matrix<double,3,16,1,3,16>,Eigen::Matrix<double,16,3,0,16,3>,Eigen::DenseShape,Eigen::DenseShape,8>
                      ::scaleAndAddTo<Eigen::Matrix<double,3,3,1,3,3>>
                                (&local_440,local_498,&local_200,(Scalar *)&local_3e8);
                      local_448.m_xpr = &local_440;
                      local_450 = &local_200;
                      local_3e8 = &local_200;
                      Eigen::internal::
                      Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
                      ::run(&local_3e0,&local_448,&local_4c9);
                      local_398 = local_3e8;
                      local_388 = 3;
                      auVar24._8_8_ = 0;
                      auVar24._0_8_ =
                           local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[0];
                      auVar25 = vbroadcastsd_avx512f(auVar24);
                      auVar33 = *(undefined1 (*) [64])
                                 (local_3e8->
                                 super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_0,_16,_3>_>).
                                 m_storage.m_data.array;
                      auVar26 = vmulpd_avx512f(auVar33,auVar25);
                      auVar4._8_8_ = 0;
                      auVar4._0_8_ = local_3e0.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                     m_storage.m_data.array[3];
                      auVar27 = vbroadcastsd_avx512f(auVar4);
                      auVar34 = *(undefined1 (*) [64])
                                 ((local_3e8->
                                  super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_0,_16,_3>_>).
                                  m_storage.m_data.array + 8);
                      auVar1 = *(undefined1 (*) [64])
                                ((local_3e8->
                                 super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_0,_16,_3>_>).
                                 m_storage.m_data.array + 0x10);
                      auVar2 = *(undefined1 (*) [64])
                                ((local_3e8->
                                 super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_0,_16,_3>_>).
                                 m_storage.m_data.array + 0x18);
                      auVar3 = *(undefined1 (*) [64])
                                ((local_3e8->
                                 super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_0,_16,_3>_>).
                                 m_storage.m_data.array + 0x20);
                      auVar5._8_8_ = 0;
                      auVar5._0_8_ = local_3e0.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                     m_storage.m_data.array[6];
                      auVar28 = vbroadcastsd_avx512f(auVar5);
                      auVar26 = vfmadd231pd_avx512f(auVar26,auVar1,auVar27);
                      auVar26 = vfmadd231pd_avx512f(auVar26,auVar3,auVar28);
                      auVar25 = vmulpd_avx512f(auVar25,auVar34);
                      auVar27 = vfmadd231pd_avx512f(auVar25,auVar2,auVar27);
                      auVar25 = *(undefined1 (*) [64])
                                 ((local_3e8->
                                  super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_0,_16,_3>_>).
                                  m_storage.m_data.array + 0x28);
                      auVar27 = vfmadd231pd_avx512f(auVar27,auVar25,auVar28);
                      auVar6._8_8_ = 0;
                      auVar6._0_8_ = local_3e0.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                     m_storage.m_data.array[1];
                      auVar28 = vbroadcastsd_avx512f(auVar6);
                      auVar7._8_8_ = 0;
                      auVar7._0_8_ = local_3e0.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                     m_storage.m_data.array[4];
                      auVar29 = vbroadcastsd_avx512f(auVar7);
                      auVar30 = vmulpd_avx512f(auVar33,auVar28);
                      auVar30 = vfmadd231pd_avx512f(auVar30,auVar1,auVar29);
                      auVar8._8_8_ = 0;
                      auVar8._0_8_ = local_3e0.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                     m_storage.m_data.array[7];
                      auVar31 = vbroadcastsd_avx512f(auVar8);
                      auVar30 = vfmadd231pd_avx512f(auVar30,auVar3,auVar31);
                      auVar28 = vmulpd_avx512f(auVar34,auVar28);
                      auVar28 = vfmadd231pd_avx512f(auVar28,auVar2,auVar29);
                      auVar28 = vfmadd231pd_avx512f(auVar28,auVar25,auVar31);
                      auVar9._8_8_ = 0;
                      auVar9._0_8_ = local_3e0.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                     m_storage.m_data.array[2];
                      auVar29 = vbroadcastsd_avx512f(auVar9);
                      auVar10._8_8_ = 0;
                      auVar10._0_8_ =
                           local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[5];
                      auVar31 = vbroadcastsd_avx512f(auVar10);
                      auVar11._8_8_ = 0;
                      auVar11._0_8_ =
                           local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[8];
                      auVar32 = vbroadcastsd_avx512f(auVar11);
                      auVar33 = vmulpd_avx512f(auVar33,auVar29);
                      auVar33 = vfmadd231pd_avx512f(auVar33,auVar31,auVar1);
                      auVar33 = vfmadd231pd_avx512f(auVar33,auVar32,auVar3);
                      auVar34 = vmulpd_avx512f(auVar34,auVar29);
                      auVar34 = vfmadd231pd_avx512f(auVar34,auVar2,auVar31);
                      auVar34 = vfmadd231pd_avx512f(auVar34,auVar25,auVar32);
                      vpermt2pd_avx512f(_DAT_009de240,auVar30);
                      _local_380 = vpermt2pd_avx512f(_DAT_009de280,auVar33);
                      vpermt2pd_avx512f(_DAT_009de2c0,auVar26);
                      local_340 = vpermt2pd_avx512f(_DAT_009de300,auVar30);
                      vpermt2pd_avx512f(_DAT_009de340,auVar33);
                      local_300 = vpermt2pd_avx512f(_DAT_009de380,auVar26);
                      vpermt2pd_avx512f(_DAT_009de240,auVar28);
                      local_2c0 = vpermt2pd_avx512f(_DAT_009de280,auVar34);
                      vpermt2pd_avx512f(_DAT_009de2c0,auVar27);
                      local_280 = vpermt2pd_avx512f(_DAT_009de300,auVar28);
                      vpermt2pd_avx512f(_DAT_009de340,auVar34);
                      local_240 = vpermt2pd_avx512f(_DAT_009de380,auVar27);
                      lVar14 = lVar20 + local_478;
                      local_390 = &local_3e0;
                      if ((lVar14 < 0) ||
                         (lVar21 = (this->m_kGQ).
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                   m_storage.m_cols *
                                   (this->m_kGQ).
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                   m_storage.m_rows, lVar21 - lVar14 == 0 || lVar21 < lVar14)) {
                        __assert_fail("index >= 0 && index < size()",
                                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                                     );
                      }
                      auVar35._8_8_ = 0;
                      auVar35._0_8_ =
                           local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[3];
                      auVar37._8_8_ = 0;
                      auVar37._0_8_ =
                           local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[4];
                      auVar39._8_8_ = 0;
                      auVar39._0_8_ =
                           local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[8];
                      auVar41._8_8_ = 0;
                      auVar41._0_8_ =
                           local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[7];
                      auVar42._8_8_ = 0;
                      auVar42._0_8_ =
                           local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[7] *
                           local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[5];
                      auVar24 = vfmsub231sd_fma(auVar42,auVar37,auVar39);
                      auVar40._8_8_ = 0;
                      auVar40._0_8_ =
                           local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[6] *
                           local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[5];
                      auVar4 = vfmsub231sd_fma(auVar40,auVar35,auVar39);
                      auVar38._8_8_ = 0;
                      auVar38._0_8_ =
                           local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[6] *
                           local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[4];
                      auVar5 = vfmsub231sd_fma(auVar38,auVar35,auVar41);
                      auVar12._8_8_ = 0x8000000000000000;
                      auVar12._0_8_ = 0x8000000000000000;
                      auVar36._8_8_ = 0;
                      auVar36._0_8_ =
                           auVar5._0_8_ *
                           local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[2] +
                           (auVar24._0_8_ *
                            local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                            m_storage.m_data.array[0] -
                           auVar4._0_8_ *
                           local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[1]);
                      auVar24 = vxorpd_avx512vl(auVar36,auVar12);
                      (this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                      .m_storage.m_data[lVar14] = auVar24._0_8_ * local_458;
                      pdVar16 = (this->m_SD).
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                                m_storage.m_data;
                      lVar14 = (this->m_SD).
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                               m_storage.m_rows;
                      if (lVar14 < 0 && pdVar16 != (double *)0x0) {
                        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                                      ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                                      "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>, Level = 0]"
                                     );
                      }
                      lVar20 = lVar20 + local_490;
                      if ((lVar20 < 0) ||
                         (lVar21 = (this->m_SD).
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                                   m_storage.m_cols, lVar21 <= lVar20)) {
LAB_00797597:
                        __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                                      "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                                     );
                      }
                      if (lVar14 != 0x10) {
                        __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                                      ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                                      "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>]"
                                     );
                      }
                      uVar15 = local_460 & 0xffffffff;
                      lVar23 = uVar22 * (lVar23 * local_470 + local_468);
                      pdVar17 = pdVar16 + local_4b0 + uVar15 + lVar23;
                      pdVar18 = (double *)local_380;
                      lVar14 = 0x10;
                      do {
                        *pdVar17 = *pdVar18;
                        pdVar18 = pdVar18 + 3;
                        pdVar17 = pdVar17 + lVar21;
                        lVar14 = lVar14 + -1;
                      } while (lVar14 != 0);
                      if ((lVar20 + 0x20 < 0) ||
                         (lVar14 = (this->m_SD).
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                                   m_storage.m_cols, lVar14 <= lVar20 + 0x20)) goto LAB_00797597;
                      pdVar17 = pdVar16 + local_4b8 + uVar15 + lVar23;
                      pdVar18 = (double *)(local_380 + 8);
                      lVar21 = 0x10;
                      do {
                        *pdVar17 = *pdVar18;
                        pdVar18 = pdVar18 + 3;
                        pdVar17 = pdVar17 + lVar14;
                        lVar21 = lVar21 + -1;
                      } while (lVar21 != 0);
                      if ((lVar20 + 0x40 < 0) ||
                         (lVar14 = (this->m_SD).
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                                   m_storage.m_cols, lVar14 <= lVar20 + 0x40)) goto LAB_00797597;
                      pdVar16 = pdVar16 + uVar15 + local_4c0 + lVar23;
                      pdVar17 = (double *)(local_380 + 0x10);
                      lVar21 = 0x10;
                      do {
                        *pdVar16 = *pdVar17;
                        pdVar17 = pdVar17 + 3;
                        pdVar16 = pdVar16 + lVar14;
                        lVar21 = lVar21 + -1;
                      } while (lVar21 != 0);
                      local_460 = (ulong)((int)local_460 + 1);
                      lVar14 = *(long *)(DAT_00b92d28 + 0x18);
                      uVar22 = *(long *)(DAT_00b92d28 + 0x20) - lVar14 >> 3;
                      uVar15 = local_470;
                    } while (local_460 < uVar22);
                  }
                  iVar19 = (int)uVar15;
                  local_4a0 = (ulong)((int)local_468 + 1);
                } while (local_4a0 <
                         (ulong)(*(long *)(DAT_00b92d28 + 0x50) - *(long *)(DAT_00b92d28 + 0x48) >>
                                3));
              }
              local_4a8 = (ulong)(iVar19 + 1);
            } while (local_4a8 <
                     (ulong)(*(long *)(DAT_00b92d28 + 0x50) - *(long *)(DAT_00b92d28 + 0x48) >> 3));
          }
          local_4c8 = local_4c8 + 1;
          local_4b0 = local_4b0 + 0x60;
          local_4b8 = local_4b8 + 0x60;
          local_4c0 = local_4c0 + 0x60;
        } while (local_4c8 < (ulong)(long)this->m_numLayers);
      }
      return;
    }
    __function = 
    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
    ;
  }
  __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,__function);
}

Assistant:

void ChElementShellANCF_3443::PrecomputeInternalForceMatricesWeightsContInt() {
    ChQuadratureTables* GQTable = GetStaticGQTables();
    unsigned int GQ_idx_xi_eta = NP - 1;  // Gauss-Quadrature table index for xi and eta
    unsigned int GQ_idx_zeta = NT - 1;    // Gauss-Quadrature table index for zeta

    m_SD.resize(NSF, 3 * m_numLayers * NIP);
    m_kGQ.resize(m_numLayers * NIP, 1);

    ChMatrixNM<double, NSF, 3> SD_precompute_D;

    for (size_t kl = 0; kl < m_numLayers; kl++) {
        double thickness = m_layers[kl].Get_thickness();
        double layer_midsurface_offset = -m_thicknessZ / 2 + m_layer_zoffsets[kl] + thickness / 2 + m_midsurfoffset;

        for (unsigned int it_xi = 0; it_xi < GQTable->Lroots[GQ_idx_xi_eta].size(); it_xi++) {
            for (unsigned int it_eta = 0; it_eta < GQTable->Lroots[GQ_idx_xi_eta].size(); it_eta++) {
                for (unsigned int it_zeta = 0; it_zeta < GQTable->Lroots[GQ_idx_zeta].size(); it_zeta++) {
                    double GQ_weight = GQTable->Weight[GQ_idx_xi_eta][it_xi] * GQTable->Weight[GQ_idx_xi_eta][it_eta] *
                                       GQTable->Weight[GQ_idx_zeta][it_zeta];
                    double xi = GQTable->Lroots[GQ_idx_xi_eta][it_xi];
                    double eta = GQTable->Lroots[GQ_idx_xi_eta][it_eta];
                    double zeta = GQTable->Lroots[GQ_idx_zeta][it_zeta];
                    auto index = it_zeta + it_eta * GQTable->Lroots[GQ_idx_zeta].size() +
                                 it_xi * GQTable->Lroots[GQ_idx_zeta].size() * GQTable->Lroots[GQ_idx_xi_eta].size();
                    ChMatrix33<double>
                        J_0xi;  // Element Jacobian between the reference configuration and normalized configuration
                    MatrixNx3c Sxi_D;  // Matrix of normalized shape function derivatives

                    Calc_Sxi_D(Sxi_D, xi, eta, zeta, thickness, layer_midsurface_offset);
                    J_0xi.noalias() = m_ebar0 * Sxi_D;

                    // Adjust the shape function derivative matrix to account for a potentially deformed reference state
                    SD_precompute_D = Sxi_D * J_0xi.inverse();
                    m_kGQ((kl * NIP) + index) = -J_0xi.determinant() * GQ_weight;

                    // Group all of the columns together in blocks, and then layer by layer across the entire element
                    m_SD.col((3 * kl * NIP) + index) = SD_precompute_D.col(0);
                    m_SD.col((3 * kl * NIP) + index + NIP) = SD_precompute_D.col(1);
                    m_SD.col((3 * kl * NIP) + index + 2 * NIP) = SD_precompute_D.col(2);
                }
            }
        }
    }
}